

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pdqsort.h
# Opt level: O1

pair<__gnu_cxx::__normal_iterator<HighsDomainChange_*,_std::vector<HighsDomainChange,_std::allocator<HighsDomainChange>_>_>,_bool>
 pdqsort_detail::
 partition_right<__gnu_cxx::__normal_iterator<HighsDomainChange*,std::vector<HighsDomainChange,std::allocator<HighsDomainChange>>>,std::less<HighsDomainChange>>
           (double *begin,double *end)

{
  double *pdVar1;
  double dVar2;
  int iVar3;
  int iVar4;
  double dVar5;
  double dVar6;
  double dVar7;
  long lVar8;
  double *pdVar9;
  double *pdVar10;
  int iVar11;
  double *pdVar12;
  double *pdVar13;
  pair<__gnu_cxx::__normal_iterator<HighsDomainChange_*,_std::vector<HighsDomainChange,_std::allocator<HighsDomainChange>_>_>,_bool>
  pVar14;
  
  dVar2 = *begin;
  iVar3 = *(int *)(begin + 1);
  iVar4 = *(int *)((long)begin + 0xc);
  for (lVar8 = 0x10;
      (iVar11 = *(int *)((long)begin + lVar8 + 8), iVar11 < iVar3 ||
      ((iVar11 <= iVar3 &&
       ((iVar11 = *(int *)((long)begin + lVar8 + 0xc), iVar11 < iVar4 ||
        ((iVar11 <= iVar4 &&
         (*(double *)((long)begin + lVar8) <= dVar2 && dVar2 != *(double *)((long)begin + lVar8)))))
       )))); lVar8 = lVar8 + 0x10) {
  }
  pdVar1 = (double *)((long)begin + lVar8);
  if (lVar8 == 0x10) {
    pdVar9 = end;
    if (end <= pdVar1) goto LAB_002ab27e;
    pdVar10 = end + -2;
    iVar11 = *(int *)(end + -1);
    pdVar9 = pdVar10;
    if (iVar11 < iVar3) goto LAB_002ab27e;
    end = end + -3;
    do {
      pdVar12 = end + 1;
      if (((iVar11 <= iVar3) &&
          ((pdVar9 = pdVar12, *(int *)((long)end + 0x14) < iVar4 ||
           ((*(int *)((long)end + 0x14) <= iVar4 &&
            (pdVar9 = pdVar10, *pdVar12 <= dVar2 && dVar2 != *pdVar12)))))) ||
         (pdVar9 = pdVar10, pdVar12 <= pdVar1)) goto LAB_002ab27e;
      pdVar10 = pdVar10 + -2;
      iVar11 = *(int *)end;
      end = end + -2;
    } while (iVar3 <= iVar11);
  }
  else {
    pdVar9 = end + -2;
    iVar11 = *(int *)(end + -1);
    if (iVar11 < iVar3) goto LAB_002ab27e;
    end = end + -3;
    do {
      if (iVar11 <= iVar3) {
        if (*(int *)((long)end + 0x14) < iVar4) goto LAB_002ab27e;
        if ((*(int *)((long)end + 0x14) <= iVar4) && (end[1] <= dVar2 && dVar2 != end[1])) break;
      }
      pdVar9 = pdVar9 + -2;
      iVar11 = *(int *)end;
      end = end + -2;
    } while (iVar3 <= iVar11);
  }
  pdVar9 = end + 1;
LAB_002ab27e:
  pdVar10 = pdVar1;
  pdVar12 = pdVar9;
  if (pdVar1 < pdVar9) {
    do {
      dVar5 = *pdVar10;
      dVar6 = pdVar10[1];
      dVar7 = pdVar12[1];
      *pdVar10 = *pdVar12;
      pdVar10[1] = dVar7;
      *pdVar12 = dVar5;
      pdVar12[1] = dVar6;
      do {
        do {
          pdVar13 = pdVar10;
          pdVar10 = pdVar13 + 2;
        } while (*(int *)(pdVar13 + 3) < iVar3);
      } while ((*(int *)(pdVar13 + 3) <= iVar3) &&
              ((*(int *)((long)pdVar13 + 0x1c) < iVar4 ||
               ((*(int *)((long)pdVar13 + 0x1c) <= iVar4 && (*pdVar10 <= dVar2 && dVar2 != *pdVar10)
                )))));
      pdVar13 = pdVar12 + -2;
      iVar11 = *(int *)(pdVar12 + -1);
      if (iVar3 <= iVar11) {
        pdVar12 = pdVar12 + -3;
        do {
          if (iVar11 <= iVar3) {
            if (*(int *)((long)pdVar12 + 0x14) < iVar4) break;
            if ((*(int *)((long)pdVar12 + 0x14) <= iVar4) &&
               (pdVar12[1] <= dVar2 && dVar2 != pdVar12[1])) goto LAB_002ab308;
          }
          pdVar13 = pdVar13 + -2;
          iVar11 = *(int *)pdVar12;
          pdVar12 = pdVar12 + -2;
        } while (iVar3 <= iVar11);
        pdVar13 = pdVar12 + 1;
      }
LAB_002ab308:
      pdVar12 = pdVar13;
    } while (pdVar10 < pdVar13);
  }
  pVar14._9_7_ = (undefined7)((ulong)pdVar9 >> 8);
  pVar14.second = pdVar9 <= pdVar1;
  dVar5 = pdVar10[-1];
  *begin = pdVar10[-2];
  begin[1] = dVar5;
  pdVar10[-2] = dVar2;
  *(int *)(pdVar10 + -1) = iVar3;
  *(int *)((long)pdVar10 - 4) = iVar4;
  pVar14.first._M_current = (HighsDomainChange *)(pdVar10 + -2);
  return pVar14;
}

Assistant:

inline std::pair<Iter, bool> partition_right(Iter begin, Iter end, Compare comp) {
        typedef typename std::iterator_traits<Iter>::value_type T;
        
        // Move pivot into local for speed.
        T pivot(PDQSORT_PREFER_MOVE(*begin));

        Iter first = begin;
        Iter last = end;

        // Find the first element greater than or equal than the pivot (the median of 3 guarantees
        // this exists).
        while (comp(*++first, pivot));

        // Find the first element strictly smaller than the pivot. We have to guard this search if
        // there was no element before *first.
        if (first - 1 == begin) while (first < last && !comp(*--last, pivot));
        else                    while (                !comp(*--last, pivot));

        // If the first pair of elements that should be swapped to partition are the same element,
        // the passed in sequence already was correctly partitioned.
        bool already_partitioned = first >= last;
        
        // Keep swapping pairs of elements that are on the wrong side of the pivot. Previously
        // swapped pairs guard the searches, which is why the first iteration is special-cased
        // above.
        while (first < last) {
            std::iter_swap(first, last);
            while (comp(*++first, pivot));
            while (!comp(*--last, pivot));
        }

        // Put the pivot in the right place.
        Iter pivot_pos = first - 1;
        *begin = PDQSORT_PREFER_MOVE(*pivot_pos);
        *pivot_pos = PDQSORT_PREFER_MOVE(pivot);

        return std::make_pair(pivot_pos, already_partitioned);
    }